

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O2

TLASInstanceDesc __thiscall
Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::GetInstanceDesc
          (TopLevelASBase<Diligent::EngineVkImplTraits> *this,char *Name)

{
  const_iterator cVar1;
  undefined8 uVar2;
  char (*in_RCX) [35];
  IBottomLevelAS *pIVar3;
  char (*in_R8) [3];
  TLASInstanceDesc TVar4;
  string msg;
  char *Name_local;
  
  Name_local = Name;
  if ((Name == (char *)0x0) || (*Name == '\0')) {
    FormatString<char[26],char[35]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Name != nullptr && Name[0] != \'\\0\'",in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetInstanceDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0xf6);
    std::__cxx11::string::~string((string *)&msg);
  }
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg,Name,false);
  cVar1 = std::
          _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_Instances)._M_h,(key_type *)&msg);
  HashMapStringKey::Clear((HashMapStringKey *)&msg);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
      ._M_cur == (__node_type *)0x0) {
    FormatString<char[47],char_const*,char[3]>
              (&msg,(Diligent *)"Can\'t find instance with the specified name (\'",
               (char (*) [47])&Name_local,(char **)0x66ef55,in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&msg);
    uVar2 = 0xffffffffffffffff;
    pIVar3 = (IBottomLevelAS *)0x0;
  }
  else {
    uVar2 = *(undefined8 *)
             ((long)cVar1.
                    super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
                    ._M_cur + 0x18);
    pIVar3 = *(IBottomLevelAS **)
              ((long)cVar1.
                     super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
                     ._M_cur + 0x20);
  }
  TVar4.pBLAS = pIVar3;
  TVar4.ContributionToHitGroupIndex = (int)uVar2;
  TVar4.InstanceIndex = (int)((ulong)uVar2 >> 0x20);
  return TVar4;
}

Assistant:

GetInstanceDesc(const char* Name) const override final
    {
        VERIFY_EXPR(Name != nullptr && Name[0] != '\0');

        TLASInstanceDesc Result = {};

        auto Iter = this->m_Instances.find(Name);
        if (Iter != this->m_Instances.end())
        {
            const auto& Inst                   = Iter->second;
            Result.ContributionToHitGroupIndex = Inst.ContributionToHitGroupIndex;
            Result.InstanceIndex               = Inst.InstanceIndex;
            Result.pBLAS                       = Inst.pBLAS;
        }
        else
        {
            Result.ContributionToHitGroupIndex = INVALID_INDEX;
            Result.InstanceIndex               = INVALID_INDEX;
            LOG_ERROR_MESSAGE("Can't find instance with the specified name ('", Name, "')");
        }

        return Result;
    }